

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O3

bool __thiscall
MemTable::_put(MemTable *this,NodePosi pred_node,longlong key,string *value,bool delete_flag)

{
  size_t *psVar1;
  result_type_conflict rVar2;
  time_t ts;
  NodePosi below_node;
  long lVar3;
  _List_node_base *p_Var4;
  QuadListNode<SSTableDataEntry> *pred_node_00;
  _List_node_base *p_Var5;
  mt19937_64 *ctx;
  QuadList<SSTableDataEntry> local_d0;
  SSTableDataEntry local_b0;
  SSTableDataEntry local_70;
  
  if (_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)::seed == '\0') {
    _put();
  }
  if (_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)::gen == '\0') {
    _put();
  }
  if (_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)::rand == '\0') {
    _put();
  }
  ts = time((time_t *)0x0);
  p_Var5 = (this->qlist).
           super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  SSTableDataEntry::SSTableDataEntry(&local_70,delete_flag,ts,key,value);
  below_node = QuadList<SSTableDataEntry>::insertAfterAbove
                         ((QuadList<SSTableDataEntry> *)(p_Var5 + 1),&local_70,pred_node,
                          (NodePosi)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value._M_dataplus._M_p != &local_70.value.field_2) {
    operator_delete(local_70.value._M_dataplus._M_p,local_70.value.field_2._M_allocated_capacity + 1
                   );
  }
  if (below_node == (NodePosi)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = (below_node->data).value._M_string_length + 0x19;
  }
  this->_size_bytes = this->_size_bytes + lVar3;
  ctx = &_put::gen;
  rVar2 = std::uniform_int_distribution<int>::operator()
                    (&_put::rand,&_put::gen,&_put::rand._M_param);
  if (rVar2 != 0) {
    p_Var5 = (_List_node_base *)&this->qlist;
    do {
      pred_node_00 = pred_node->above;
      p_Var4 = p_Var5->_M_prev;
      if (pred_node_00 == (QuadListNode<SSTableDataEntry> *)0x0) {
        do {
          if (((NodePosi)p_Var4[1]._M_prev == pred_node) ||
             ((NodePosi)p_Var4[2]._M_next == pred_node)) {
            if (p_Var4 == (this->qlist).
                          super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next) {
              local_d0._vptr_QuadList = (_func_int **)&PTR__QuadList_00112d00;
              local_d0._size = 0;
              QuadList<SSTableDataEntry>::init(&local_d0,(EVP_PKEY_CTX *)ctx);
              p_Var4 = (_List_node_base *)operator_new(0x30);
              p_Var4[1]._M_next = (_List_node_base *)&PTR__QuadList_00112d00;
              p_Var4[1]._M_prev = (_List_node_base *)local_d0.header;
              p_Var4[2]._M_next = (_List_node_base *)local_d0.trailer;
              *(int *)&p_Var4[2]._M_prev = local_d0._size;
              local_d0.header = (NodePosi)0x0;
              local_d0.trailer = (NodePosi)0x0;
              std::__detail::_List_node_base::_M_hook(p_Var4);
              psVar1 = &(this->qlist).
                        super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
                        ._M_impl._M_node._M_size;
              *psVar1 = *psVar1 + 1;
              QuadList<SSTableDataEntry>::~QuadList(&local_d0);
              p_Var4 = p_Var5->_M_prev;
            }
            p_Var5 = p_Var4->_M_prev;
            pred_node_00 = (QuadListNode<SSTableDataEntry> *)p_Var5[1]._M_prev;
            goto LAB_00106c0f;
          }
          pred_node = pred_node->pred;
          pred_node_00 = pred_node->above;
        } while (pred_node_00 == (QuadListNode<SSTableDataEntry> *)0x0);
      }
      p_Var5 = p_Var4->_M_prev;
LAB_00106c0f:
      SSTableDataEntry::SSTableDataEntry(&local_b0,delete_flag,0,key,"");
      below_node = QuadList<SSTableDataEntry>::insertAfterAbove
                             ((QuadList<SSTableDataEntry> *)(p_Var5 + 1),&local_b0,pred_node_00,
                              below_node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.value._M_dataplus._M_p != &local_b0.value.field_2) {
        operator_delete(local_b0.value._M_dataplus._M_p,
                        local_b0.value.field_2._M_allocated_capacity + 1);
      }
      ctx = &_put::gen;
      rVar2 = std::uniform_int_distribution<int>::operator()
                        (&_put::rand,&_put::gen,&_put::rand._M_param);
      p_Var5 = p_Var4;
      pred_node = pred_node_00;
    } while (rVar2 != 0);
  }
  this->_size = this->_size + 1;
  return true;
}

Assistant:

bool MemTable::_put(NodePosi pred_node, long long key, std::string value, bool delete_flag) {
    auto curr_level = qlist.rbegin(); // If skipSearch didn't find k, it must return a appropriate position
    // at the bottom of qlist for insert a new tower of k
    static auto seed = time(nullptr);
    static auto gen = std::mt19937_64{static_cast<unsigned long long> (seed)};
    static auto rand = std::uniform_int_distribution<>{0, 1};
    auto timestamp = time(nullptr);
    auto new_node = curr_level->insertAfterAbove(MemTableEntry{delete_flag, timestamp, key, std::move(value)},
                                                 pred_node);
    _size_bytes += size_of_node(new_node);
    while (rand(gen)) {
        while (!pred_node->above && curr_level->valid(pred_node))
            pred_node = pred_node->pred;
        if (pred_node->above) {
            // Find a node of a tower.
            pred_node = pred_node->above;
            curr_level++;
        } else {
            // Unable to find a tower higher than curr_level.
            if (--(curr_level.base()) == qlist.begin()) {
                // If the tower should grow though top of SkipList arrived, add a level as top
                qlist.push_front(MemTableLevel{});
            }
            curr_level++;
            pred_node = curr_level->first();
        }
        // Do not repeat data on upper node to save memory, because skipSearch always turn to bottom if hit.
        new_node = curr_level->insertAfterAbove(MemTableEntry{delete_flag, 0, key, ""}, pred_node, new_node);
    }
    _size++;
    return true;
}